

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O3

void __thiscall
cnn::ShadowLookupParameters::ShadowLookupParameters
          (ShadowLookupParameters *this,LookupParameters *lp)

{
  pointer pTVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__range1;
  Tensor *t;
  pointer d;
  ushort uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  int iVar19;
  
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&this->h,&lp->values);
  d = (this->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_start;
  pTVar1 = (this->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (d != pTVar1) {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      uVar9 = (ulong)(d->d).nd;
      if (uVar9 == 0) {
        iVar19 = 1;
      }
      else {
        auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar16 = vpbroadcastq_avx512f();
        uVar10 = 0;
        do {
          auVar17 = vpbroadcastq_avx512f();
          auVar18 = vmovdqa64_avx512f(auVar15);
          auVar15 = vporq_avx512f(auVar17,auVar13);
          auVar17 = vporq_avx512f(auVar17,auVar14);
          uVar5 = vpcmpuq_avx512f(auVar17,auVar16,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar15,auVar16,2);
          bVar7 = (byte)uVar5;
          uVar11 = CONCAT11(bVar7,bVar6);
          auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((d->d).d + uVar10));
          auVar17._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar15._4_4_;
          auVar17._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
          auVar17._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar15._8_4_;
          auVar17._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar15._12_4_;
          auVar17._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar15._16_4_;
          auVar17._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar15._20_4_;
          auVar17._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar15._24_4_;
          auVar17._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar15._28_4_;
          auVar17._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
          auVar17._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
          auVar17._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
          auVar17._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
          auVar17._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
          auVar17._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
          auVar17._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
          auVar17._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
          uVar10 = uVar10 + 0x10;
          auVar15 = vpmulld_avx512f(auVar17,auVar18);
        } while ((uVar9 + 0xf & 0xfffffffffffffff0) != uVar10);
        auVar13 = vmovdqa32_avx512f(auVar15);
        auVar14._0_4_ = (uint)(bVar6 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_
        ;
        bVar2 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar14._4_4_ = (uint)bVar2 * auVar13._4_4_ | (uint)!bVar2 * auVar18._4_4_;
        bVar2 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar14._8_4_ = (uint)bVar2 * auVar13._8_4_ | (uint)!bVar2 * auVar18._8_4_;
        bVar2 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar14._12_4_ = (uint)bVar2 * auVar13._12_4_ | (uint)!bVar2 * auVar18._12_4_;
        bVar2 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar14._16_4_ = (uint)bVar2 * auVar13._16_4_ | (uint)!bVar2 * auVar18._16_4_;
        bVar2 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar14._20_4_ = (uint)bVar2 * auVar13._20_4_ | (uint)!bVar2 * auVar18._20_4_;
        bVar2 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar14._24_4_ = (uint)bVar2 * auVar13._24_4_ | (uint)!bVar2 * auVar18._24_4_;
        bVar2 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar14._28_4_ = (uint)bVar2 * auVar13._28_4_ | (uint)!bVar2 * auVar18._28_4_;
        auVar14._32_4_ =
             (uint)(bVar7 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar14._36_4_ = (uint)bVar2 * auVar13._36_4_ | (uint)!bVar2 * auVar18._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar14._40_4_ = (uint)bVar2 * auVar13._40_4_ | (uint)!bVar2 * auVar18._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar14._44_4_ = (uint)bVar2 * auVar13._44_4_ | (uint)!bVar2 * auVar18._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar14._48_4_ = (uint)bVar2 * auVar13._48_4_ | (uint)!bVar2 * auVar18._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar14._52_4_ = (uint)bVar2 * auVar13._52_4_ | (uint)!bVar2 * auVar18._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar14._56_4_ = (uint)bVar2 * auVar13._56_4_ | (uint)!bVar2 * auVar18._56_4_;
        auVar14._60_4_ =
             (uint)(bVar7 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
        auVar12 = vextracti64x4_avx512f(auVar14,1);
        auVar13 = vpmulld_avx512f(auVar14,ZEXT3264(auVar12));
        auVar3 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        iVar19 = auVar3._0_4_;
      }
      pfVar8 = (float *)cnn_mm_malloc((ulong)(iVar19 * (d->d).bd) << 2,0x100);
      d->v = pfVar8;
      TensorTools::Zero(d);
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      d = d + 1;
    } while (d != pTVar1);
  }
  return;
}

Assistant:

ShadowLookupParameters::ShadowLookupParameters(const LookupParameters& lp) : h(lp.values) {
  for (auto& t : h) {
    t.v = (float*)cnn_mm_malloc(t.d.size() * sizeof(float), 256);
    TensorTools::Zero(t);
  }
}